

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O0

Cut_CMan_t * Cut_CManStart(void)

{
  Cut_CMan_t *__s;
  st__table *psVar1;
  Extra_MmFixed_t *pEVar2;
  int local_18;
  uint local_14;
  int k;
  int i;
  Cut_CMan_t *p;
  
  __s = (Cut_CMan_t *)malloc(0x1440);
  memset(__s,0,0x1440);
  psVar1 = st__init_table(st__ptrcmp,st__ptrhash);
  __s->tTable = psVar1;
  pEVar2 = Extra_MmFixedStart(0x98);
  __s->pMem = pEVar2;
  for (local_18 = 0; local_18 < 9; local_18 = local_18 + 1) {
    for (local_14 = 0; (int)local_14 < 0x200; local_14 = local_14 + 1) {
      if ((local_14 & 1 << ((byte)local_18 & 0x1f)) != 0) {
        __s->uInputs[local_18][(int)local_14 >> 5] =
             1 << ((byte)local_14 & 0x1f) | __s->uInputs[local_18][(int)local_14 >> 5];
      }
    }
  }
  s_pCMan = __s;
  return __s;
}

Assistant:

Cut_CMan_t * Cut_CManStart()
{
    Cut_CMan_t * p;
    int i, k;
    // start the manager
    assert( sizeof(unsigned) == 4 );
    p = ABC_ALLOC( Cut_CMan_t, 1 );
    memset( p, 0, sizeof(Cut_CMan_t) );
    // start the table and the memory manager
    p->tTable = st__init_table( st__ptrcmp, st__ptrhash);;
    p->pMem = Extra_MmFixedStart( sizeof(Cut_Cell_t) );
    // set elementary truth tables
    for ( k = 0; k < CUT_CELL_MVAR; k++ )
        for ( i = 0; i < (1<<CUT_CELL_MVAR); i++ )
            if ( i & (1 << k) )
                p->uInputs[k][i>>5] |= (1 << (i&31));
    s_pCMan = p;
    return p;
}